

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O1

int __thiscall
cpp_db::sqlite_parameters::bind(sqlite_parameters *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  type_index tVar4;
  undefined7 extraout_var;
  sqlite3_stmt *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  size_t sVar8;
  void *pvVar9;
  void *__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  long lVar10;
  value *extraout_RDX;
  value *extraout_RDX_00;
  value *extraout_RDX_01;
  value *extraout_RDX_02;
  value *pvVar11;
  undefined4 in_register_00000034;
  parameter *this_00;
  undefined1 *puVar12;
  ulong uVar13;
  blob source;
  string local_70;
  string local_50;
  
  this_00 = (parameter *)CONCAT44(in_register_00000034,__fd);
  if ((this_00->name)._M_string_length == 0 && -1 < this_00->index) {
    iVar2 = parameter::get_index(this_00);
  }
  else {
    parameter::get_name_abi_cxx11_(&local_50,this_00);
    iVar2 = find_param_pos(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  tVar4 = type_of((value *)this_00);
  pcVar7 = *(char **)(tVar4._M_target + 8);
  if ((pcVar7 == _put) || ((*pcVar7 != '*' && (iVar3 = strcmp(pcVar7,_put), iVar3 == 0)))) {
    psVar5 = get_stmt_handle(this);
    iVar3 = numeric_extractor<int>((value *)this_00);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)sqlite3_bind_int(psVar5,iVar2,iVar3);
  }
  else {
    tVar4 = type_of((value *)this_00);
    pcVar7 = *(char **)(tVar4._M_target + 8);
    if ((pcVar7 == _typeinfo) ||
       ((*pcVar7 != '*' && (iVar3 = strcmp(pcVar7,_typeinfo), iVar3 == 0)))) {
      psVar5 = get_stmt_handle(this);
      numeric_extractor<double>((value *)this_00);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)sqlite3_bind_double(psVar5,iVar2);
    }
    else {
      tVar4 = type_of((value *)this_00);
      pcVar7 = *(char **)(tVar4._M_target + 8);
      if ((pcVar7 == _sqlite3_column_name) ||
         ((*pcVar7 != '*' && (iVar3 = strcmp(pcVar7,_sqlite3_column_name), iVar3 == 0)))) {
        pcVar7 = value_of<char_const*>((value *)this_00);
        sVar8 = strlen(pcVar7);
        pvVar9 = operator_new__(sVar8 + 1);
        sVar8 = strlen(pcVar7);
        memcpy(pvVar9,pcVar7,sVar8 + 1);
        psVar5 = get_stmt_handle(this);
        sVar8 = strlen(pcVar7);
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)sqlite3_bind_text(psVar5,iVar2,pvVar9,sVar8 & 0xffffffff,delete_array<char>);
      }
      else {
        tVar4 = type_of((value *)this_00);
        pcVar7 = *(char **)(tVar4._M_target + 8);
        pvVar11 = extraout_RDX;
        if ((pcVar7 == "NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE") ||
           ((*pcVar7 != '*' &&
            (iVar3 = strcmp(pcVar7,"NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE"),
            pvVar11 = extraout_RDX_00, iVar3 == 0)))) {
          value_of<std::__cxx11::string>(&local_70,(cpp_db *)this_00,pvVar11);
          uVar13 = CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length) + 1;
          pvVar9 = operator_new__(uVar13);
          memcpy(pvVar9,(void *)CONCAT44(local_70._M_dataplus._M_p._4_4_,
                                         (int)local_70._M_dataplus._M_p),uVar13);
          psVar5 = get_stmt_handle(this);
          sqlite3_bind_text(psVar5,iVar2,pvVar9,(int)local_70._M_string_length,delete_array<char>);
          paVar6 = &local_70.field_2;
          puVar12 = (undefined1 *)
                    CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12 == paVar6) goto LAB_00109e61;
          uVar13 = local_70.field_2._M_allocated_capacity + 1;
        }
        else {
          tVar4 = type_of((value *)this_00);
          pcVar7 = *(char **)(tVar4._M_target + 8);
          pvVar11 = extraout_RDX_01;
          if ((pcVar7 != "St6vectorIhSaIhEE") &&
             ((*pcVar7 == '*' ||
              (iVar3 = strcmp(pcVar7,"St6vectorIhSaIhEE"), pvVar11 = extraout_RDX_02, iVar3 != 0))))
          {
            tVar4 = type_of((value *)this_00);
            pcVar7 = *(char **)(tVar4._M_target + 8);
            if ((pcVar7 == _typeinfo) ||
               ((*pcVar7 != '*' && (iVar3 = strcmp(pcVar7,_typeinfo), iVar3 == 0)))) {
              psVar5 = get_stmt_handle(this);
              lVar10 = numeric_extractor<long>((value *)this_00);
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)sqlite3_bind_int64(psVar5,iVar2,lVar10);
            }
            else {
              bVar1 = is_null(this_00);
              paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)CONCAT71(extraout_var,bVar1);
              if (bVar1) {
                psVar5 = get_stmt_handle(this);
                paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)sqlite3_bind_null(psVar5,iVar2);
              }
            }
            goto LAB_00109e61;
          }
          value_of<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70,
                     (cpp_db *)this_00,pvVar11);
          pvVar9 = (void *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p);
          uVar13 = CONCAT44(local_70._M_string_length._4_4_,(int)local_70._M_string_length) -
                   (long)pvVar9;
          __dest = operator_new__(uVar13);
          memcpy(__dest,pvVar9,uVar13);
          psVar5 = get_stmt_handle(this);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)sqlite3_bind_blob(psVar5,iVar2,__dest,
                                        (int)local_70._M_string_length -
                                        (int)local_70._M_dataplus._M_p,delete_array<unsigned_char>);
          puVar12 = (undefined1 *)
                    CONCAT44(local_70._M_dataplus._M_p._4_4_,(int)local_70._M_dataplus._M_p);
          if (puVar12 == (undefined1 *)0x0) goto LAB_00109e61;
          uVar13 = local_70.field_2._M_allocated_capacity - (long)puVar12;
        }
        operator_delete(puVar12,uVar13);
        paVar6 = extraout_RAX;
      }
    }
  }
LAB_00109e61:
  return (int)paVar6;
}

Assistant:

void sqlite_parameters::bind(const parameter &param)
{
    int index = param.has_index() ? param.get_index() : find_param_pos(param.get_name());
    if (type_of(param) == typeid(int))
        sqlite3_bind_int(get_stmt_handle(), index, value_of<int>(param));
    else if (type_of(param) == typeid(double))
        sqlite3_bind_double(get_stmt_handle(), index, value_of<double>(param));
    else if (type_of(param) == typeid(const char *))
    {
        const char *source = value_of<const char *>(param);
        char * value = new char[strlen(source) + 1];
        memcpy(value, source, strlen(source) + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(strlen(source)), delete_array<char>);
    }
    else if (type_of(param) == typeid(std::string))
    {
        std::string source(value_of<std::string>(param));
        char * value = new char[source.length() + 1];
        memcpy(value, source.c_str(), source.length() + 1);
		sqlite3_bind_text(get_stmt_handle(), index, value, static_cast<int>(source.length()), delete_array<char>);
    }
    else if (type_of(param) == typeid(blob))
    {
        blob source(value_of<blob>(param));
        uint8_t *value = new uint8_t[source.size()];
        memcpy(value, source.data(), source.size());
		sqlite3_bind_blob(get_stmt_handle(), index, value, static_cast<int>(source.size()), delete_array<uint8_t>);
    }
    else if (type_of(param) == typeid(int64_t))
        sqlite3_bind_int64(get_stmt_handle(), index, value_of<int64_t>(param));
    else if (is_null(param))
		sqlite3_bind_null(get_stmt_handle(), index);
}